

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O3

Instr * Peeps::CleanupLabel(LabelInstr *instr,LabelInstr *instrNext)

{
  SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *this;
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  undefined4 *puVar4;
  Type *ppBVar5;
  LabelInstr *newLabelInstr;
  LabelInstr *pLVar6;
  
  bVar3 = instrNext->field_0x78;
  if ((bVar3 & 5) == 0) {
    newLabelInstr = instr;
    pLVar6 = (LabelInstr *)(instrNext->super_Instr).m_next;
    instr = instrNext;
  }
  else {
    bVar3 = instr->field_0x78;
    newLabelInstr = instrNext;
    pLVar6 = instrNext;
    if ((bVar3 & 5) != 0) {
      return &instrNext->super_Instr;
    }
  }
  this = &instr->labelRefs;
  if ((SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
      (instr->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
      super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
      super_SListNodeBase<Memory::ArenaAllocator>.next != this) {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      ppBVar5 = SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::Head
                          ((SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)this);
      bVar2 = IR::BranchInstr::ReplaceTarget(*ppBVar5,instr,newLabelInstr);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                           ,0x3f7,"(replaced)","replaced");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
    } while ((SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
             (this->super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>).
             super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
             super_SListNodeBase<Memory::ArenaAllocator>.next != this);
    bVar3 = instr->field_0x78;
  }
  if ((bVar3 & 2) != 0) {
    bVar3 = newLabelInstr->field_0x78;
    newLabelInstr->field_0x78 = bVar3 | 2;
    if ((instr->field_0x78 & 0x20) != 0) {
      newLabelInstr->field_0x78 = bVar3 | 0x22;
    }
  }
  IR::Instr::Remove(&instr->super_Instr);
  return &pLVar6->super_Instr;
}

Assistant:

IR::Instr *
Peeps::CleanupLabel(IR::LabelInstr * instr, IR::LabelInstr * instrNext)
{
    IR::Instr * returnInstr;

    IR::LabelInstr * labelToRemove;
    IR::LabelInstr * labelToKeep;

    // Just for dump, always keep loop top labels
    // We also can remove label that has non branch references
    if (instrNext->m_isLoopTop || instrNext->m_hasNonBranchRef)
    {
        if (instr->m_isLoopTop || instr->m_hasNonBranchRef)
        {
            // Don't remove loop top labels or labels with non branch references
            return instrNext;
        }
        labelToRemove = instr;
        labelToKeep = instrNext;
        returnInstr = instrNext;
    }
    else
    {
        labelToRemove = instrNext;
        labelToKeep = instr;
        returnInstr = instrNext->m_next;
    }
    while (!labelToRemove->labelRefs.Empty())
    {
        bool replaced = labelToRemove->labelRefs.Head()->ReplaceTarget(labelToRemove, labelToKeep);
        Assert(replaced);
    }

    if (labelToRemove->isOpHelper)
    {
        labelToKeep->isOpHelper = true;
#if DBG
        if (labelToRemove->m_noHelperAssert)
        {
            labelToKeep->m_noHelperAssert = true;
        }
#endif
    }

    labelToRemove->Remove();
    return returnInstr;
}